

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O3

void __thiscall Token::Token(Token *this,ObjectStoreToken *inToken)

{
  undefined1 uVar1;
  int iVar2;
  MutexFactory *this_00;
  Mutex *pMVar3;
  SecureDataManager *this_01;
  ByteString userPINBlob;
  ByteString soPINBlob;
  ByteString local_60;
  ByteString local_38;
  
  this->_vptr_Token = (_func_int **)&PTR__Token_0019dd88;
  this_00 = MutexFactory::i();
  pMVar3 = MutexFactory::getMutex(this_00);
  this->tokenMutex = pMVar3;
  this->token = inToken;
  ByteString::ByteString(&local_38);
  ByteString::ByteString(&local_60);
  iVar2 = (*this->token->_vptr_ObjectStoreToken[1])(this->token,&local_38);
  if ((char)iVar2 == '\0') {
    uVar1 = false;
  }
  else {
    iVar2 = (*this->token->_vptr_ObjectStoreToken[3])(this->token,&local_60);
    uVar1 = (undefined1)iVar2;
  }
  this->valid = (bool)uVar1;
  this_01 = (SecureDataManager *)operator_new(0xd0);
  SecureDataManager::SecureDataManager(this_01,&local_38,&local_60);
  this->sdm = this_01;
  local_60._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_60.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_38._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_38.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return;
}

Assistant:

Token::Token(ObjectStoreToken* inToken)
{
	tokenMutex = MutexFactory::i()->getMutex();

	token = inToken;

	ByteString soPINBlob, userPINBlob;

	valid = token->getSOPIN(soPINBlob) && token->getUserPIN(userPINBlob);

	sdm = new SecureDataManager(soPINBlob, userPINBlob);
}